

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

void __thiscall
slang::ast::ValueRangeExpression::serializeTo(ValueRangeExpression *this,ASTSerializer *serializer)

{
  string_view sVar1;
  
  ASTSerializer::write(serializer,4,"left",(size_t)this->left_);
  ASTSerializer::write(serializer,5,"right",(size_t)this->right_);
  sVar1 = ast::toString(this->rangeKind);
  ASTSerializer::write(serializer,9,"rangeKind",sVar1._M_len);
  return;
}

Assistant:

void ValueRangeExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("left", left());
    serializer.write("right", right());
    serializer.write("rangeKind", toString(rangeKind));
}